

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  initializer_list<int> __l;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> v;
  int local_14 [3];
  
  print_compiler();
  local_14[0] = 2;
  local_14[1] = 3;
  local_14[2] = 4;
  __l._M_len = 3;
  __l._M_array = local_14;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,&local_31);
  poVar1 = std::operator<<((ostream *)&std::cout,"v[1] = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[1]);
  std::operator<<(poVar1,'\n');
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

extern template class std::vector<int>;

int main (int argc, char* argv[]) 
{
    print_compiler();

    std::vector<int> v= {2, 3, 4};
    std::cout << "v[1] = " << v[1] << '\n';

    return 0;
}